

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-buffer.c
# Opt level: O0

void test_init(void)

{
  int iVar1;
  BUFFER buf;
  void *in_stack_ffffffffffffffe8;
  BUFFER *in_stack_fffffffffffffff0;
  BUFFER *local_8;
  
  buffer_init((BUFFER *)&stack0xffffffffffffffe8);
  buffer_append(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,0x104910);
  acutest_check_((int)(ulong)(in_stack_fffffffffffffff0 == (BUFFER *)0x5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x27,"%s","buf.size == 5");
  acutest_check_((int)(ulong)(in_stack_fffffffffffffff0 <= local_8),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x28,"%s","buf.alloc >= buf.size");
  iVar1 = memcmp(in_stack_ffffffffffffffe8,"hello",5);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-buffer.c"
                 ,0x29,"%s","memcmp(buf.data, \"hello\", 5) == 0");
  buffer_fini((BUFFER *)0x1049c7);
  return;
}

Assistant:

static void
test_init(void)
{
    BUFFER buf;

    buffer_init(&buf);

    buffer_append(&buf, "hello", 5);

    TEST_CHECK(buf.size == 5);
    TEST_CHECK(buf.alloc >= buf.size);
    TEST_CHECK(memcmp(buf.data, "hello", 5) == 0);

    buffer_fini(&buf);
}